

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::ListVector::ReferenceEntry(Vector *vector,Vector *other)

{
  shared_ptr<duckdb::VectorBuffer,_true> *unaff_retaddr;
  
  shared_ptr<duckdb::VectorBuffer,_true>::operator=
            ((shared_ptr<duckdb::VectorBuffer,_true> *)other,unaff_retaddr);
  return;
}

Assistant:

void ListVector::ReferenceEntry(Vector &vector, Vector &other) {
	D_ASSERT(vector.GetType().id() == LogicalTypeId::LIST);
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR ||
	         vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(other.GetType().id() == LogicalTypeId::LIST);
	D_ASSERT(other.GetVectorType() == VectorType::FLAT_VECTOR || other.GetVectorType() == VectorType::CONSTANT_VECTOR);
	vector.auxiliary = other.auxiliary;
}